

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mytools.cpp
# Opt level: O1

size_t jpgClean(uchar *data,size_t len)

{
  size_t sVar1;
  bool bVar2;
  
  if (len != 0) {
    sVar1 = 1;
    do {
      if ((data[sVar1 - 1] == 0xff) && (data[sVar1] == 0xd9)) {
        return sVar1;
      }
      bVar2 = sVar1 != len;
      sVar1 = sVar1 + 1;
    } while (bVar2);
  }
  return len;
}

Assistant:

size_t jpgClean(const unsigned char *data, size_t len)
{
    uint8_t EOI[2] = {0xff, 0xd9};

    for(size_t i=0; i<len; i++)
    {
        if(*data++ == EOI[0]) {
            if(*data == EOI[1]) {
                if(i+1 <= len) {
                    return (i+1);
                }
            }
        }
    }
    return len;
}